

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

optional<long_long> __thiscall QHttpHeaders::intValue(QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *this_00;
  undefined8 uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  optional<long_long> oVar3;
  QByteArrayView QVar4;
  anon_class_1_0_00000001 local_69;
  _Storage<QByteArrayView,_true> local_68;
  undefined1 *local_58;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_48;
  char local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._M_value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68._M_value.m_data = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (this->d).d.ptr;
  HeaderName::HeaderName((HeaderName *)&local_48._M_first,name);
  QHttpHeadersPrivate::findValue
            ((optional<QByteArrayView> *)&local_68._M_value,this_00,(HeaderName *)&local_48._M_first
            );
  uVar1 = SEXT18(local_30);
  if ((undefined1 *)uVar1 != (undefined1 *)0xffffffffffffffff) {
    uVar1 = (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
              ::_S_vtable._M_arr[uVar1]._M_data)
                      (&local_69,
                       (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_48._M_first);
  }
  if ((char)local_58 == '\x01') {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVar4.m_data = (storage_type *)local_68._M_value.m_size;
    QVar4.m_size = (qsizetype)&local_48;
    QtPrivate::toSignedInteger(QVar4,(int)local_68._M_value.m_data);
    uVar1 = local_48._0_8_;
    if ((local_48._8_8_ & 1) != 0) {
      uVar1 = 0;
    }
    uVar2 = (ulong)CONCAT31((int3)((ulong)local_48._8_8_ >> 8),~(byte)local_48._8_8_) &
            0xffffffffffffff01;
  }
  else {
    uVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = uVar2;
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = uVar1;
  return (optional<long_long>)
         oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

const noexcept
{
    std::optional<QByteArrayView> v = d->findValue(HeaderName{name});
    if (!v)
        return std::nullopt;
    bool ok = false;
    const qint64 result = v->toLongLong(&ok);
    if (ok)
        return result;
    return std::nullopt;
}